

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Gia_ManCreateGate(Gia_Man_t *pNew,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  int iVar1;
  int iLit0;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  iVar1 = vSuper->nSize;
  if (0 < iVar1) {
    uVar6 = iVar1 - 1;
    vSuper->nSize = uVar6;
    if (uVar6 != 0) {
      iLit0 = vSuper->pArray[uVar6];
      vSuper->nSize = iVar1 - 2U;
      iVar1 = vSuper->pArray[iVar1 - 2U];
      uVar6 = (uint)*(undefined8 *)pObj;
      if (((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0) ||
         (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar6 & 0x1fffffff))) {
        uVar6 = Gia_ManHashAnd(pNew,iLit0,iVar1);
      }
      else if (pNew->pMuxes == (uint *)0x0) {
        uVar6 = Gia_ManHashXor(pNew,iLit0,iVar1);
      }
      else {
        uVar6 = Gia_ManHashXorReal(pNew,iLit0,iVar1);
      }
      Vec_IntPush(vSuper,uVar6);
      if (-1 < (int)uVar6) {
        if (pNew->nObjs <= (int)(uVar6 >> 1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        Gia_ObjSetGateLevel(pNew,pNew->pObjs + (uVar6 >> 1));
        uVar7 = (ulong)vSuper->nSize;
        if (1 < (long)uVar7) {
          do {
            if ((long)vSuper->nSize < (long)uVar7) {
LAB_00708437:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar6 = vSuper->pArray[uVar7 - 1];
            if ((int)uVar6 < 0) goto LAB_00708456;
            uVar2 = vSuper->pArray[uVar7 - 2];
            uVar8 = uVar6 >> 1;
            pVVar3 = pNew->vLevels;
            Vec_IntFillExtra(pVVar3,uVar8 + 1,0);
            if (pVVar3->nSize <= (int)uVar8) goto LAB_00708437;
            if ((int)uVar2 < 0) goto LAB_00708456;
            iVar1 = pVVar3->pArray[uVar8];
            uVar8 = uVar2 >> 1;
            pVVar3 = pNew->vLevels;
            Vec_IntFillExtra(pVVar3,uVar8 + 1,0);
            if (pVVar3->nSize <= (int)uVar8) goto LAB_00708437;
            if (iVar1 <= pVVar3->pArray[uVar8]) {
              return;
            }
            if ((long)vSuper->nSize < (long)uVar7) {
LAB_00708475:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            piVar4 = vSuper->pArray;
            piVar4[uVar7 - 1] = uVar2;
            if ((long)vSuper->nSize <= (long)(uVar7 - 2)) goto LAB_00708475;
            piVar4[uVar7 - 2] = uVar6;
            bVar5 = 2 < uVar7;
            uVar7 = uVar7 - 1;
          } while (bVar5);
        }
        return;
      }
LAB_00708456:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
}

Assistant:

void Gia_ManCreateGate( Gia_Man_t * pNew, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    int iLit0 = Vec_IntPop(vSuper);
    int iLit1 = Vec_IntPop(vSuper);
//    int iLit1 = Gia_ManFindSharedNode(pNew, vSuper, iLit0);
    int iLit, i;
    if ( !Gia_ObjIsXor(pObj) )
        iLit = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    else if ( pNew->pMuxes )
        iLit = Gia_ManHashXorReal( pNew, iLit0, iLit1 );
    else 
        iLit = Gia_ManHashXor( pNew, iLit0, iLit1 );
    Vec_IntPush( vSuper, iLit );
    Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(iLit)) );
    // shift to the corrent location
    for ( i = Vec_IntSize(vSuper)-1; i > 0; i-- )
    {
        int iLit1 = Vec_IntEntry(vSuper, i);
        int iLit2 = Vec_IntEntry(vSuper, i-1);
        if ( Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit1)) <= Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit2)) )
            break;
        Vec_IntWriteEntry( vSuper, i,   iLit2 );
        Vec_IntWriteEntry( vSuper, i-1, iLit1 );
    }
}